

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_container_cardinality(run_container_t *run)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar2 + 4) & 0x20) == 0) {
    iVar1 = run->n_runs;
    lVar2 = (long)iVar1;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        iVar1 = iVar1 + (uint)run->runs[lVar3].length;
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    return iVar1;
  }
  iVar1 = _avx2_run_container_cardinality(run);
  return iVar1;
}

Assistant:

int run_container_cardinality(const run_container_t *run) {
    const int32_t n_runs = run->n_runs;
    const rle16_t *runs = run->runs;

    /* by initializing with n_runs, we omit counting the +1 for each pair. */
    int sum = n_runs;
    for (int k = 0; k < n_runs; ++k) {
        sum += runs[k].length;
    }

    return sum;
}